

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O2

void __thiscall Fl_Tree_Item::Fl_Tree_Item(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs)

{
  Fl_Tree *tree;
  
  Fl_Tree_Item_Array::Fl_Tree_Item_Array(&this->_children,10);
  _Init(this,prefs,tree);
  return;
}

Assistant:

Fl_Tree_Item::Fl_Tree_Item(const Fl_Tree_Prefs &prefs) {
  _Init(prefs, 0);
}